

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::AppendFilenameSuffix
                   (string *__return_storage_ptr__,string *filename,string *suffix)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it_dot;
  size_type pos;
  string *suffix_local;
  string *filename_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  it_dot._M_current = (char *)std::__cxx11::string::rfind((char)filename,0x2e);
  if (it_dot._M_current == (char *)0xffffffffffffffff) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)filename);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    local_40._M_current = (char *)std::__cxx11::string::begin();
    local_38 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_40,it_dot._M_current);
    _Var1._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)__return_storage_ptr__,_Var1,local_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    _Var1._M_current = local_38._M_current;
    __last._M_current = (char *)std::__cxx11::string::end();
    std::__cxx11::string::
    append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)__return_storage_ptr__,_Var1,__last);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::AppendFilenameSuffix(std::string const& filename,
                                              std::string const& suffix)
{
  std::string res;
  auto pos = filename.rfind('.');
  if (pos != std::string::npos) {
    const auto it_dot = filename.begin() + pos;
    res.assign(filename.begin(), it_dot);
    res.append(suffix);
    res.append(it_dot, filename.end());
  } else {
    res = filename;
    res.append(suffix);
  }
  return res;
}